

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O0

Abc_Obj_t *
Abc_NodeBalance_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNodeOld,Vec_Vec_t *vStorage,int Level,
                   int fDuplicate,int fSelective,int fUpdateLevel)

{
  Abc_Aig_t *pMan_00;
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *p1;
  int local_7c;
  int local_64;
  int LeftBound;
  int i;
  Vec_Ptr_t *vSuper;
  Abc_Obj_t *pNode2;
  Abc_Obj_t *pNode1;
  Abc_Obj_t *pNodeNew;
  Abc_Aig_t *pMan;
  int fSelective_local;
  int fDuplicate_local;
  int Level_local;
  Vec_Vec_t *vStorage_local;
  Abc_Obj_t *pNodeOld_local;
  Abc_Ntk_t *pNtkNew_local;
  
  pMan_00 = (Abc_Aig_t *)pNtkNew->pManFunc;
  iVar1 = Abc_ObjIsComplement(pNodeOld);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNodeOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                  ,0xf7,
                  "Abc_Obj_t *Abc_NodeBalance_rec(Abc_Ntk_t *, Abc_Obj_t *, Vec_Vec_t *, int, int, int, int)"
                 );
  }
  if ((pNodeOld->field_6).pTemp == (void *)0x0) {
    iVar1 = Abc_ObjIsNode(pNodeOld);
    if (iVar1 == 0) {
      __assert_fail("Abc_ObjIsNode(pNodeOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                    ,0xfb,
                    "Abc_Obj_t *Abc_NodeBalance_rec(Abc_Ntk_t *, Abc_Obj_t *, Vec_Vec_t *, int, int, int, int)"
                   );
    }
    p = Abc_NodeBalanceCone(pNodeOld,vStorage,Level,fDuplicate,fSelective);
    if (p->nSize == 0) {
      pAVar2 = Abc_AigConst1(pNtkNew);
      pAVar2 = Abc_ObjNot(pAVar2);
      (pNodeOld->field_6).pCopy = pAVar2;
      pNtkNew_local = (Abc_Ntk_t *)(pNodeOld->field_6).pCopy;
    }
    else {
      for (local_64 = 0; local_64 < p->nSize; local_64 = local_64 + 1) {
        pAVar2 = Abc_ObjRegular((Abc_Obj_t *)p->pArray[local_64]);
        pAVar2 = Abc_NodeBalance_rec(pNtkNew,pAVar2,vStorage,Level + 1,fDuplicate,fSelective,
                                     fUpdateLevel);
        iVar1 = Abc_ObjIsComplement((Abc_Obj_t *)p->pArray[local_64]);
        pAVar2 = Abc_ObjNotCond(pAVar2,iVar1);
        p->pArray[local_64] = pAVar2;
      }
      if (p->nSize < 2) {
        printf("BUG!\n");
      }
      Vec_PtrSort(p,Abc_NodeCompareLevelsDecrease);
      if (p->nSize < 2) {
        __assert_fail("vSuper->nSize > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                      ,0x10f,
                      "Abc_Obj_t *Abc_NodeBalance_rec(Abc_Ntk_t *, Abc_Obj_t *, Vec_Vec_t *, int, int, int, int)"
                     );
      }
      while (1 < p->nSize) {
        if (fUpdateLevel == 0) {
          local_7c = 0;
        }
        else {
          local_7c = Abc_NodeBalanceFindLeft(p);
        }
        Abc_NodeBalancePermute(pNtkNew,p,local_7c);
        pAVar2 = (Abc_Obj_t *)Vec_PtrPop(p);
        p1 = (Abc_Obj_t *)Vec_PtrPop(p);
        pAVar2 = Abc_AigAnd(pMan_00,pAVar2,p1);
        Abc_VecObjPushUniqueOrderByLevel(p,pAVar2);
      }
      if ((pNodeOld->field_6).pTemp != (void *)0x0) {
        __assert_fail("pNodeOld->pCopy == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                      ,0x11c,
                      "Abc_Obj_t *Abc_NodeBalance_rec(Abc_Ntk_t *, Abc_Obj_t *, Vec_Vec_t *, int, int, int, int)"
                     );
      }
      pNodeOld->field_6 = *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)p->pArray;
      p->nSize = 0;
      pNtkNew_local = (Abc_Ntk_t *)(pNodeOld->field_6).pCopy;
    }
  }
  else {
    pNtkNew_local = (Abc_Ntk_t *)(pNodeOld->field_6).pCopy;
  }
  return (Abc_Obj_t *)pNtkNew_local;
}

Assistant:

Abc_Obj_t * Abc_NodeBalance_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNodeOld, Vec_Vec_t * vStorage, int Level, int fDuplicate, int fSelective, int fUpdateLevel )
{
    Abc_Aig_t * pMan = (Abc_Aig_t *)pNtkNew->pManFunc;
    Abc_Obj_t * pNodeNew, * pNode1, * pNode2;
    Vec_Ptr_t * vSuper;
    int i, LeftBound;
    assert( !Abc_ObjIsComplement(pNodeOld) );
    // return if the result if known
    if ( pNodeOld->pCopy )
        return pNodeOld->pCopy;
    assert( Abc_ObjIsNode(pNodeOld) );
    // get the implication supergate
//    Abc_NodeBalanceConeExor( pNodeOld );
    vSuper = Abc_NodeBalanceCone( pNodeOld, vStorage, Level, fDuplicate, fSelective );
    if ( vSuper->nSize == 0 )
    { // it means that the supergate contains two nodes in the opposite polarity
        pNodeOld->pCopy = Abc_ObjNot(Abc_AigConst1(pNtkNew));
        return pNodeOld->pCopy;
    }
    // for each old node, derive the new well-balanced node
    for ( i = 0; i < vSuper->nSize; i++ )
    {
        pNodeNew = Abc_NodeBalance_rec( pNtkNew, Abc_ObjRegular((Abc_Obj_t *)vSuper->pArray[i]), vStorage, Level + 1, fDuplicate, fSelective, fUpdateLevel );
        vSuper->pArray[i] = Abc_ObjNotCond( pNodeNew, Abc_ObjIsComplement((Abc_Obj_t *)vSuper->pArray[i]) );
    }
    if ( vSuper->nSize < 2 )
        printf( "BUG!\n" );
    // sort the new nodes by level in the decreasing order
    Vec_PtrSort( vSuper, (int (*)(void))Abc_NodeCompareLevelsDecrease );
    // balance the nodes
    assert( vSuper->nSize > 1 );
    while ( vSuper->nSize > 1 )
    {
        // find the left bound on the node to be paired
        LeftBound = (!fUpdateLevel)? 0 : Abc_NodeBalanceFindLeft( vSuper );
        // find the node that can be shared (if no such node, randomize choice)
        Abc_NodeBalancePermute( pNtkNew, vSuper, LeftBound );
        // pull out the last two nodes
        pNode1 = (Abc_Obj_t *)Vec_PtrPop(vSuper);
        pNode2 = (Abc_Obj_t *)Vec_PtrPop(vSuper);
        Abc_VecObjPushUniqueOrderByLevel( vSuper, Abc_AigAnd(pMan, pNode1, pNode2) );
    }
    // make sure the balanced node is not assigned
    assert( pNodeOld->pCopy == NULL );
    // mark the old node with the new node
    pNodeOld->pCopy = (Abc_Obj_t *)vSuper->pArray[0];
    vSuper->nSize = 0;
//    if ( Abc_ObjRegular(pNodeOld->pCopy) == Abc_AigConst1(pNtkNew) )
//        printf( "Constant node\n" );
//    assert( pNodeOld->Level >= Abc_ObjRegular(pNodeOld->pCopy)->Level );
    return pNodeOld->pCopy;
}